

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  PingClient client;
  allocator<char> local_112;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  PingServer local_d0;
  
  if (argc < 3) {
    if (argc != 2) {
      PingServer::PingServer(&local_d0);
      Dashel::Hub::run();
      local_d0._0_8_ = &PTR__PingServer_00104d48;
      std::
      _Rb_tree<Dashel::Stream_*,_std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<Dashel::Stream_*,_std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&local_d0 + 0x88));
      goto LAB_00102428;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,argv[1],&local_112);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"default message, the other side does lack creativity","");
    PingClient::PingClient((PingClient *)&local_d0,&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_00102368;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,argv[1],&local_112);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,argv[2],&local_111);
    PingClient::PingClient((PingClient *)&local_d0,&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_00102368:
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
LAB_00102428:
  Dashel::Hub::~Hub(&local_d0.super_Hub);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 2)
		{
			PingClient client(argv[1], argv[2]);
		}
		else if (argc > 1)
		{
			PingClient client(argv[1], "default message, the other side does lack creativity");
		}
		else
		{
			PingServer().run();
		}
	}
	catch (const DashelException& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}